

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O2

newtRef NcLexicalLookup(newtRefArg start,newtRef name)

{
  _Bool _Var1;
  newtRef nVar2;
  newtRef rcvr;
  
  while( true ) {
    _Var1 = NewtRefIsNotNIL(start);
    if (!_Var1) {
      return 0xfff2;
    }
    nVar2 = NcResolveMagicPointer(start);
    if ((~(uint)nVar2 & 3) == 0) break;
    rcvr = nVar2;
    _Var1 = NewtHasSlot(nVar2,name);
    if (_Var1) {
      nVar2 = NsGetSlot(rcvr,nVar2,name);
      return nVar2;
    }
    start = NsGetSlot(rcvr,nVar2,newt_sym._nextArgFrame);
  }
  return 0xfff2;
}

Assistant:

newtRef NcLexicalLookup(newtRefArg start, newtRef name)
{
    newtRefVar	current = start;
    
    while (NewtRefIsNotNIL(current))
    {
        current = NcResolveMagicPointer(current);
        
        if (NewtRefIsMagicPointer(current))
            return kNewtRefUnbind;
        
        if (NewtHasSlot(current, name))
            return NcGetSlot(current, name);
        
        current = NcGetSlot(current, NSSYM0(_nextArgFrame));
    }
    
    return kNewtRefUnbind;
}